

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_value_tmp_tests.hpp
# Opt level: O1

void __thiscall
iutest::tr1::
ValueTmpParamTestInstance<iu_TestValueType_x_iutest_x_Equal_Test,_iutest::detail::VariadicTypeList<iutest::TemplateValue<10L>,_iutest::TemplateValue<0L>_>_>
::EachTest<iutest::detail::VariadicTypeList<iutest::TemplateValue<0L>_>,_void>::EachTest
          (EachTest<iutest::detail::VariadicTypeList<iutest::TemplateValue<0L>_>,_void> *this,
          char *testsuite,char *name,size_t index,char *file,int line)

{
  TestSuite *pTVar1;
  allocator<char> local_39;
  string local_38;
  
  pTVar1 = AddTestSuite(testsuite,index,file,line);
  (this->m_mediator).super_iuITestSuiteMediator.m_test_suite = pTVar1;
  (this->m_mediator).super_iuITestSuiteMediator._vptr_iuITestSuiteMediator =
       (_func_int **)&PTR__iuITestSuiteMediator_0013f5e0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  TestInfo::TestInfo(&this->m_info,(iuITestSuiteMediator *)this,&local_38,
                     &(this->m_factory).super_iuFactoryBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->m_factory).super_iuFactoryBase._vptr_iuFactoryBase =
       (_func_int **)&PTR__iuFactoryBase_0013fba8;
  return;
}

Assistant:

EachTest(const char* testsuite, const char* name, size_t index, const char* file, int line)
            : m_mediator(AddTestSuite(testsuite, index, file, line))
            , m_info(&m_mediator, name, &m_factory)
            , m_next(testsuite, name, index+1, file, line)
        {
        }